

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::TreeMap<int,_kj::StringPtr>::Entry_&> __thiscall
kj::
Table<kj::TreeMap<int,kj::StringPtr>::Entry,kj::TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>>
::find<0ul,int&>(Table<kj::TreeMap<int,kj::StringPtr>::Entry,kj::TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>>
                 *this,int *params)

{
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  StringPtr *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::TreeMap<int,_kj::StringPtr>::Entry> AVar3;
  unsigned_long *pos;
  StringPtr *local_50;
  int *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  int *params_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(params + 8));
  AVar3 = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::asPtr
                    ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)params);
  fwd<int&>((int *)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (int *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (StringPtr *)pHVar1;
  TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>::
  find<kj::TreeMap<int,kj::StringPtr>::Entry,int&>
            ((TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks> *)&local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::TreeMap<int,_kj::StringPtr>::Entry_&>::Maybe
              ((Maybe<kj::TreeMap<int,_kj::StringPtr>::Entry_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator[]
                  ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)params,*puVar2);
    Maybe<kj::TreeMap<int,_kj::StringPtr>::Entry_&>::Maybe
              ((Maybe<kj::TreeMap<int,_kj::StringPtr>::Entry_&> *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::TreeMap<int,_kj::StringPtr>::Entry_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}